

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

void plutovg_matrix_shear(plutovg_matrix_t *matrix,float shx,float shy)

{
  undefined1 local_30 [8];
  plutovg_matrix_t m;
  float shy_local;
  float shx_local;
  plutovg_matrix_t *matrix_local;
  
  m.e = shy;
  m.f = shx;
  plutovg_matrix_init_shear((plutovg_matrix_t *)local_30,shx,shy);
  plutovg_matrix_multiply(matrix,(plutovg_matrix_t *)local_30,matrix);
  return;
}

Assistant:

void plutovg_matrix_shear(plutovg_matrix_t* matrix, float shx, float shy)
{
    plutovg_matrix_t m;
    plutovg_matrix_init_shear(&m, shx, shy);
    plutovg_matrix_multiply(matrix, &m, matrix);
}